

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

int vocisect(objnum *list1,objnum *list2)

{
  int iVar1;
  long lVar2;
  objnum oVar3;
  objnum *poVar4;
  long lVar5;
  objnum oVar6;
  
  oVar3 = *list1;
  if (oVar3 == 0xffff) {
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    iVar1 = 0;
    do {
      oVar6 = *list2;
      poVar4 = list2 + 1;
      while (oVar6 != 0xffff) {
        if (oVar3 == oVar6) {
          lVar5 = (long)iVar1;
          iVar1 = iVar1 + 1;
          list1[lVar5] = oVar3;
          break;
        }
        oVar6 = *poVar4;
        poVar4 = poVar4 + 1;
      }
      oVar3 = list1[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (oVar3 != 0xffff);
  }
  list1[iVar1] = 0xffff;
  return iVar1;
}

Assistant:

static int vocisect(objnum *list1, objnum *list2)
{
    int i, j, k;

    for (i = k = 0 ; list1[i] != MCMONINV ; ++i)
    {
        for (j = 0 ; list2[j] != MCMONINV ; ++j)
        {
            if (list1[i] == list2[j])
            {
                list1[k++] = list1[i];
                break;
            }
        }
    }
    list1[k] = MCMONINV;
    return(k);
}